

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_consider(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  int iVar2;
  CHAR_DATA *arg2;
  char *pcVar3;
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    pcVar3 = "Consider killing whom?\n\r";
  }
  else {
    arg2 = get_char_room(ch,arg);
    if (arg2 != (CHAR_DATA *)0x0) {
      uVar1 = (int)arg2->level - (int)ch->level;
      if ((int)uVar1 < -9) {
        pcVar3 = "Your sneeze would kill $N.";
      }
      else if ((int)uVar1 < -4) {
        pcVar3 = "$N wouldn\'t last long against you.";
      }
      else if ((int)uVar1 < -1) {
        pcVar3 = "$N looks like an easy kill.";
      }
      else if ((int)uVar1 < 2) {
        pcVar3 = "$N is about a perfect match for you!";
      }
      else if (uVar1 < 5) {
        pcVar3 = "$N looks a little tough.";
      }
      else {
        pcVar3 = "You must have a fascination with death.";
        if (uVar1 < 10) {
          pcVar3 = "You wouldn\'t last too long against $N by yourself.";
        }
      }
      act(pcVar3,ch,(void *)0x0,arg2,3);
      iVar2 = (int)arg2->size - (int)ch->size;
      if (iVar2 < 2) {
        if (iVar2 == 1) {
          pcVar3 = "$N is considerably larger than you.";
        }
        else if (arg2->size == ch->size) {
          pcVar3 = "$N is about the same size as you.";
        }
        else {
          pcVar3 = "You tower over $N.  Be careful not to step on $M.";
          if (iVar2 == -1) {
            pcVar3 = "$N is considerably smaller than you.";
          }
        }
      }
      else {
        pcVar3 = "$N easily towers over you.";
      }
      act(pcVar3,ch,(void *)0x0,arg2,3);
      if (arg2->alignment < 1) {
        return;
      }
      act("$N seems relatively benign.",ch,(void *)0x0,arg2,3);
      return;
    }
    pcVar3 = "They\'re not here.\n\r";
  }
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_consider(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Consider killing whom?\n\r", ch);
		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They're not here.\n\r", ch);
		return;
	}

	auto diff = victim->level - ch->level;
	if (diff <= -10)
		act("Your sneeze would kill $N.", ch, 0, victim, TO_CHAR);
	else if (diff <= -5)
		act("$N wouldn't last long against you.", ch, 0, victim, TO_CHAR);
	else if (diff <= -2)
		act("$N looks like an easy kill.", ch, 0, victim, TO_CHAR);
	else if (diff <= 1)
		act("$N is about a perfect match for you!", ch, 0, victim, TO_CHAR);
	else if (diff <= 4)
		act("$N looks a little tough.", ch, 0, victim, TO_CHAR);
	else if (diff <= 9)
		act("You wouldn't last too long against $N by yourself.", ch, 0, victim, TO_CHAR);
	else
		act("You must have a fascination with death.", ch, 0, victim, TO_CHAR);

	diff = victim->size - ch->size;
	if (diff > 1)
		act("$N easily towers over you.", ch, 0, victim, TO_CHAR);
	else if (diff == 1)
		act("$N is considerably larger than you.", ch, 0, victim, TO_CHAR);
	else if (!diff)
		act("$N is about the same size as you.", ch, 0, victim, TO_CHAR);
	else if (diff == -1)
		act("$N is considerably smaller than you.", ch, 0, victim, TO_CHAR);
	else if (diff < -1)
		act("You tower over $N.  Be careful not to step on $M.", ch, 0, victim, TO_CHAR);

	if (victim->alignment >= 1)
		act("$N seems relatively benign.", ch, 0, victim, TO_CHAR);
}